

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

int glu::TextureTestUtil::compareGenMipmapBox
              (ConstPixelBufferAccess *dst,ConstPixelBufferAccess *src,PixelBufferAccess *errorMask,
              GenMipmapPrecision *precision)

{
  bool bVar1;
  int x;
  int y_00;
  int iVar2;
  int y;
  int z;
  RGBA local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  float local_e8;
  float local_e4;
  RGBA *local_e0;
  PixelBufferAccess *local_d8;
  ConstPixelBufferAccess *local_d0;
  Vec4 local_c8;
  Vec4 result;
  LookupPrecision lookupPrec;
  Sampler local_78;
  
  local_e8 = (float)(dst->m_size).m_data[0];
  local_f0 = (float)(dst->m_size).m_data[1];
  local_ec = (float)(src->m_size).m_data[0];
  local_f4 = (float)(src->m_size).m_data[1];
  local_78.wrapS = CLAMP_TO_EDGE;
  local_78.wrapT = CLAMP_TO_EDGE;
  local_78.wrapR = CLAMP_TO_EDGE;
  local_78.minFilter = LINEAR;
  local_78.magFilter = LINEAR;
  local_78.lodThreshold = 0.0;
  local_78.normalizedCoords = false;
  local_78.depthStencilMode = MODE_DEPTH;
  local_78.compare = COMPAREMODE_NONE;
  local_78.compareChannel = 0;
  local_78.borderColor.v.uData[0]._0_1_ = 0;
  local_78.borderColor.v._1_7_ = 0;
  local_78.borderColor.v.uData[2]._0_1_ = 0;
  local_78._45_8_ = 0;
  local_d8 = errorMask;
  local_d0 = src;
  tcu::LookupPrecision::LookupPrecision(&lookupPrec);
  lookupPrec.colorThreshold.m_data._0_8_ = *(undefined8 *)(precision->colorThreshold).m_data;
  lookupPrec.colorThreshold.m_data._8_8_ = *(undefined8 *)((precision->colorThreshold).m_data + 2);
  lookupPrec.colorMask.m_data = *&(precision->colorMask).m_data;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&result,0x16);
  lookupPrec.coordBits.m_data[2] = (int)result.m_data[2];
  lookupPrec.coordBits.m_data[0] = (int)result.m_data[0];
  lookupPrec.coordBits.m_data[1] = (int)result.m_data[1];
  lookupPrec.uvwBits.m_data._0_8_ = *(undefined8 *)(precision->filterBits).m_data;
  lookupPrec.uvwBits.m_data[2] = (precision->filterBits).m_data[2];
  iVar2 = 0;
  local_e0 = &local_f8;
  for (z = 0; z < (dst->m_size).m_data[1]; z = z + 1) {
    local_e4 = floorf(((float)z / local_f0) * local_f4);
    local_e4 = local_e4 + 1.0;
    for (y_00 = 0; y_00 < (dst->m_size).m_data[0]; y_00 = y_00 + 1) {
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&result,(int)dst,y_00,z);
      local_c8.m_data[0] = floorf(((float)y_00 / local_e8) * local_ec);
      local_c8.m_data[0] = local_c8.m_data[0] + 1.0;
      local_c8.m_data[1] = local_e4;
      bVar1 = tcu::isLinearSampleResultValid
                        (local_d0,&local_78,&lookupPrec,(Vec2 *)&local_c8,0,&result);
      if (bVar1) {
        local_f8.m_value = 0xff00ff00;
      }
      else {
        local_f8.m_value = 0xff0000ff;
      }
      tcu::RGBA::toVec(local_e0);
      tcu::PixelBufferAccess::setPixel(local_d8,&local_c8,y_00,z,0);
      iVar2 = iVar2 + (uint)!bVar1;
    }
  }
  return iVar2;
}

Assistant:

static int compareGenMipmapBox (const tcu::ConstPixelBufferAccess& dst, const tcu::ConstPixelBufferAccess& src, const tcu::PixelBufferAccess& errorMask, const GenMipmapPrecision& precision)
{
	DE_ASSERT(dst.getDepth() == 1 && src.getDepth() == 1); // \todo [2013-10-29 pyry] 3D textures.

	const float		dstW		= float(dst.getWidth());
	const float		dstH		= float(dst.getHeight());
	const float		srcW		= float(src.getWidth());
	const float		srcH		= float(src.getHeight());
	int				numFailed	= 0;

	// Translation to lookup verification parameters.
	const tcu::Sampler		sampler		(tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE,
										 tcu::Sampler::LINEAR, tcu::Sampler::LINEAR, 0.0f, false /* non-normalized coords */);
	tcu::LookupPrecision	lookupPrec;

	lookupPrec.colorThreshold	= precision.colorThreshold;
	lookupPrec.colorMask		= precision.colorMask;
	lookupPrec.coordBits		= tcu::IVec3(22);
	lookupPrec.uvwBits			= precision.filterBits;

	for (int y = 0; y < dst.getHeight(); y++)
	for (int x = 0; x < dst.getWidth(); x++)
	{
		const tcu::Vec4	result	= dst.getPixel(x, y);
		const float		cx		= deFloatFloor(float(x) / dstW * srcW) + 1.0f;
		const float		cy		= deFloatFloor(float(y) / dstH * srcH) + 1.0f;
		const bool		isOk	= tcu::isLinearSampleResultValid(src, sampler, lookupPrec, tcu::Vec2(cx, cy), 0, result);

		errorMask.setPixel(isOk ? tcu::RGBA::green().toVec() : tcu::RGBA::red().toVec(), x, y);
		if (!isOk)
			numFailed += 1;
	}

	return numFailed;
}